

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_heap.c
# Opt level: O2

void vmcache_free(heap *heap,ptr_ext_t *first_extent)

{
  size_t sVar1;
  ptr_ext_t *ppVar2;
  long lVar3;
  ptr_ext_t *ppVar4;
  undefined1 local_58 [8];
  heap_entry he;
  extent local_40;
  
  util_mutex_lock(&heap->lock);
  if (first_extent == (ptr_ext_t *)0x0) {
    local_40.size = 0;
    ppVar2 = (ptr_ext_t *)0x0;
  }
  else {
    local_40.size = *(ulong *)(first_extent + -8) & 0x7fffffffffffffff;
    ppVar2 = *(ptr_ext_t **)(first_extent + -0x18);
  }
  he.size = (size_t)&heap->first_extent;
  lVar3 = 0;
  local_40.ptr = first_extent;
  while (ppVar4 = ppVar2, sVar1 = local_40.size, local_40.ptr != (ptr_ext_t *)0x0) {
    vmcache_heap_merge(heap,&local_40,(heap_entry *)local_58);
    vmcache_insert_heap_entry(heap,(heap_entry *)local_58,(ptr_ext_t **)he.size,0);
    if (ppVar4 == (ptr_ext_t *)0x0) {
      local_40.size = 0;
      ppVar2 = (ptr_ext_t *)0x0;
    }
    else {
      local_40.size = *(ulong *)(ppVar4 + -8) & 0x7fffffffffffffff;
      ppVar2 = *(ptr_ext_t **)(ppVar4 + -0x18);
    }
    lVar3 = lVar3 + sVar1;
    local_40.ptr = ppVar4;
  }
  heap->size_used = heap->size_used - lVar3;
  util_mutex_unlock(&heap->lock);
  return;
}

Assistant:

void
vmcache_free(struct heap *heap, ptr_ext_t *first_extent)
{
	LOG(3, "heap %p first_extent %p", heap, first_extent);

	util_mutex_lock(&heap->lock);

	size_t freed = 0;

	/*
	 * EXTENTS_FOREACH_SAFE variant is required here,
	 * because vmcache_insert_heap_entry() can modify
	 * the headers of the 'ext' extent.
	 */
	ptr_ext_t *__next;
	struct extent ext;
	EXTENTS_FOREACH_SAFE(ext, first_extent, __next) {
		/* size without headers */
		freed += ext.size;

		struct heap_entry he;
		vmcache_heap_merge(heap, &ext, &he);
		vmcache_insert_heap_entry(heap,
					&he, &heap->first_extent, IS_FREE);
	}

#ifdef STATS_ENABLED
	heap->size_used -= freed;
#endif

	util_mutex_unlock(&heap->lock);
}